

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaContentModelDump(xmlSchemaParticlePtr particle,FILE *output,int depth)

{
  xmlSchemaTreeItemPtr_conflict pxVar1;
  ulong uVar2;
  xmlChar *pxVar3;
  char *pcVar4;
  size_t sStack_b0;
  xmlChar *local_a0;
  char shift [100];
  
  do {
    local_a0 = (xmlChar *)0x0;
    for (uVar2 = 0; ((long)uVar2 < (long)depth && (uVar2 < 0x19)); uVar2 = uVar2 + 1) {
      (shift + uVar2 * 2)[0] = ' ';
      (shift + uVar2 * 2)[1] = ' ';
    }
    (shift + uVar2 * 2)[0] = '\0';
    (shift + uVar2 * 2)[1] = '\0';
    fputs(shift,(FILE *)output);
    pxVar1 = particle->children;
    if (pxVar1 == (xmlSchemaTreeItemPtr_conflict)0x0) {
      pcVar4 = "MISSING particle term\n";
      sStack_b0 = 0x16;
      goto LAB_001b04a6;
    }
    switch(pxVar1->type) {
    case XML_SCHEMA_TYPE_SEQUENCE:
      pcVar4 = "SEQUENCE";
      sStack_b0 = 8;
      break;
    case XML_SCHEMA_TYPE_CHOICE:
      pcVar4 = "CHOICE";
      sStack_b0 = 6;
      break;
    case XML_SCHEMA_TYPE_ALL:
      pcVar4 = "ALL";
      goto LAB_001b04c9;
    case XML_SCHEMA_TYPE_SIMPLE_CONTENT:
    case XML_SCHEMA_TYPE_COMPLEX_CONTENT:
    case XML_SCHEMA_TYPE_UR:
    case XML_SCHEMA_TYPE_RESTRICTION:
    case XML_SCHEMA_TYPE_EXTENSION:
switchD_001b0474_caseD_9:
      pcVar4 = "UNKNOWN\n";
      sStack_b0 = 8;
LAB_001b04a6:
      fwrite(pcVar4,sStack_b0,1,(FILE *)output);
      return;
    case XML_SCHEMA_TYPE_ELEMENT:
      pxVar3 = xmlSchemaFormatQName(&local_a0,*(xmlChar **)(pxVar1 + 3),(xmlChar *)pxVar1->next);
      fprintf((FILE *)output,"ELEM \'%s\'",pxVar3);
      if (local_a0 != (xmlChar *)0x0) {
        (*xmlFree)(local_a0);
      }
      goto LAB_001b051f;
    default:
      if (pxVar1->type != XML_SCHEMA_TYPE_ANY) goto switchD_001b0474_caseD_9;
      pcVar4 = "ANY";
LAB_001b04c9:
      sStack_b0 = 3;
    }
    fwrite(pcVar4,sStack_b0,1,(FILE *)output);
LAB_001b051f:
    if (particle->minOccurs != 1) {
      fprintf((FILE *)output," min: %d");
    }
    if (particle->maxOccurs < 0x40000000) {
      if (particle->maxOccurs != 1) {
        fprintf((FILE *)output," max: %d");
      }
    }
    else {
      fwrite(" max: unbounded",0xf,1,(FILE *)output);
    }
    fputc(10,(FILE *)output);
    if ((pxVar1->type - XML_SCHEMA_TYPE_SEQUENCE < 3) &&
       ((xmlSchemaParticlePtr)pxVar1->children != (xmlSchemaParticlePtr)0x0)) {
      xmlSchemaContentModelDump((xmlSchemaParticlePtr)pxVar1->children,output,depth + 1);
    }
    particle = (xmlSchemaParticlePtr)particle->next;
    if (particle == (xmlSchemaParticlePtr)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void
xmlSchemaContentModelDump(xmlSchemaParticlePtr particle, FILE * output, int depth)
{
    xmlChar *str = NULL;
    xmlSchemaTreeItemPtr term;
    char shift[100];
    int i;

    if (particle == NULL)
	return;
    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;
    fprintf(output, "%s", shift);
    if (particle->children == NULL) {
	fprintf(output, "MISSING particle term\n");
	return;
    }
    term = particle->children;
    if (term == NULL) {
	fprintf(output, "(NULL)");
    } else {
	switch (term->type) {
	    case XML_SCHEMA_TYPE_ELEMENT:
		fprintf(output, "ELEM '%s'", xmlSchemaFormatQName(&str,
		    ((xmlSchemaElementPtr)term)->targetNamespace,
		    ((xmlSchemaElementPtr)term)->name));
		FREE_AND_NULL(str);
		break;
	    case XML_SCHEMA_TYPE_SEQUENCE:
		fprintf(output, "SEQUENCE");
		break;
	    case XML_SCHEMA_TYPE_CHOICE:
		fprintf(output, "CHOICE");
		break;
	    case XML_SCHEMA_TYPE_ALL:
		fprintf(output, "ALL");
		break;
	    case XML_SCHEMA_TYPE_ANY:
		fprintf(output, "ANY");
		break;
	    default:
		fprintf(output, "UNKNOWN\n");
		return;
	}
    }
    if (particle->minOccurs != 1)
	fprintf(output, " min: %d", particle->minOccurs);
    if (particle->maxOccurs >= UNBOUNDED)
	fprintf(output, " max: unbounded");
    else if (particle->maxOccurs != 1)
	fprintf(output, " max: %d", particle->maxOccurs);
    fprintf(output, "\n");
    if (term &&
	((term->type == XML_SCHEMA_TYPE_SEQUENCE) ||
	 (term->type == XML_SCHEMA_TYPE_CHOICE) ||
	 (term->type == XML_SCHEMA_TYPE_ALL)) &&
	 (term->children != NULL)) {
	xmlSchemaContentModelDump((xmlSchemaParticlePtr) term->children,
	    output, depth +1);
    }
    if (particle->next != NULL)
	xmlSchemaContentModelDump((xmlSchemaParticlePtr) particle->next,
		output, depth);
}